

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseProtoDecl(Parser *this)

{
  EnumDef *pEVar1;
  pointer pcVar2;
  StructDef *pSVar3;
  int iVar4;
  int iVar5;
  Namespace *pNVar6;
  Parser *in_RSI;
  Namespace *pNVar7;
  bool inside_oneof;
  bool bVar8;
  string id;
  StructDef *struct_def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  struct_comment;
  undefined1 local_90 [32];
  StructDef *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((in_RSI->super_ParserState).token_ == 0x104) {
    iVar4 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
    inside_oneof = iVar4 == 0;
  }
  else {
    inside_oneof = false;
  }
  if ((in_RSI->super_ParserState).token_ == 0x104) {
    iVar4 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
    if (iVar4 != 0) goto LAB_0012d85f;
    ParseNamespace(this);
    goto LAB_0012da6f;
  }
LAB_0012d85f:
  if ((in_RSI->super_ParserState).token_ == 0x104) {
    iVar4 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
    bVar8 = iVar4 == 0;
  }
  else {
    bVar8 = false;
  }
  iVar4 = (int)in_RSI;
  if ((bVar8 | inside_oneof) == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&(in_RSI->super_ParserState).doc_comment_);
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      local_70 = (StructDef *)0x0;
      if (inside_oneof == false) {
        pcVar2 = (in_RSI->super_ParserState).attribute_._M_dataplus._M_p;
        local_90._0_8_ = (EnumDef *)(local_90 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar2,
                   pcVar2 + (in_RSI->super_ParserState).attribute_._M_string_length);
        Expect(this,iVar4);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          StartStruct(this,(string *)in_RSI,(StructDef **)local_90);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012dae8;
          pNVar6 = (Namespace *)operator_new(0x20);
          (pNVar6->components).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pNVar6->from_table = 0;
          (pNVar6->components).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar6->components).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pNVar7 = in_RSI->current_namespace_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pNVar6,&pNVar7->components);
          pNVar6->from_table = pNVar7->from_table;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pNVar6,(value_type *)local_90);
          pNVar6->from_table = pNVar6->from_table + 1;
          pNVar7 = in_RSI->current_namespace_;
          pNVar6 = UniqueNamespace(in_RSI,pNVar6);
          in_RSI->current_namespace_ = pNVar6;
          bVar8 = true;
        }
        else {
LAB_0012dae8:
          bVar8 = false;
          pNVar7 = (Namespace *)0x0;
        }
        if ((EnumDef *)local_90._0_8_ != (EnumDef *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        if (bVar8) {
LAB_0012dc7b:
          pSVar3 = local_70;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&(local_70->super_Definition).doc_comment,&local_48);
          ParseProtoFields(this,(StructDef *)in_RSI,SUB81(pSVar3,0),inside_oneof);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            if (inside_oneof == false) {
              in_RSI->current_namespace_ = pNVar7;
            }
            if ((in_RSI->super_ParserState).token_ == 0x3b) {
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012d8af;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            goto LAB_0012da78;
          }
        }
      }
      else {
        if ((in_RSI->super_ParserState).token_ == 0x2e) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012d8af;
        }
        pEVar1 = (EnumDef *)(local_90 + 0x10);
        pcVar2 = (in_RSI->super_ParserState).attribute_._M_dataplus._M_p;
        local_90._0_8_ = pEVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar2,
                   pcVar2 + (in_RSI->super_ParserState).attribute_._M_string_length);
        Expect(this,iVar4);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          ParseNamespacing(this,(string *)in_RSI,(string *)local_90);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            local_70 = LookupCreateStruct(in_RSI,(string *)local_90,false,false);
            if (local_70 == (StructDef *)0x0) {
              std::operator+(&local_68,"cannot extend unknown message type: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              Error(this,(string *)in_RSI);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0012da44;
            }
            if ((EnumDef *)local_90._0_8_ != pEVar1) {
              operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
            }
            pNVar7 = (Namespace *)0x0;
            goto LAB_0012dc7b;
          }
        }
LAB_0012da44:
        if ((EnumDef *)local_90._0_8_ != pEVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
    }
LAB_0012d8af:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    goto LAB_0012da7d;
  }
  if ((in_RSI->super_ParserState).token_ == 0x104) {
    iVar5 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
    if (iVar5 != 0) goto LAB_0012d8e0;
    ParseEnum(this,SUB81(in_RSI,0),(EnumDef **)0x0,local_90);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
    if ((in_RSI->super_ParserState).token_ == 0x3b) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
    }
    EnumDef::RemoveDuplicates((EnumDef *)local_90._0_8_);
  }
  else {
LAB_0012d8e0:
    if ((in_RSI->super_ParserState).token_ != 0x104) {
LAB_0012d902:
      if ((in_RSI->super_ParserState).token_ == 0x104) {
        iVar5 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
        if (iVar5 == 0) {
          ParseProtoOption(this);
          goto LAB_0012db95;
        }
      }
      if ((in_RSI->super_ParserState).token_ == 0x104) {
        iVar5 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
        if (iVar5 == 0) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
          Expect(this,iVar4);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
          ParseProtoCurliesOrIdent(this);
          goto LAB_0012da6f;
        }
      }
      TokenToStringId_abi_cxx11_(&local_68,in_RSI,(in_RSI->super_ParserState).token_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     "don\'t know how to parse .proto declaration starting with ",&local_68);
      Error(this,(string *)in_RSI);
      if ((EnumDef *)local_90._0_8_ != (EnumDef *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0012da7d;
    }
    iVar5 = std::__cxx11::string::compare((char *)&(in_RSI->super_ParserState).attribute_);
    if (iVar5 != 0) goto LAB_0012d902;
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
    Expect(this,iVar4);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
    Expect(this,iVar4);
LAB_0012db95:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
    Expect(this,iVar4);
LAB_0012da6f:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012da7d;
  }
LAB_0012da78:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_0012da7d:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoDecl() {
  bool isextend = IsIdent("extend");
  if (IsIdent("package")) {
    // These are identical in syntax to FlatBuffer's namespace decl.
    ECHECK(ParseNamespace());
  } else if (IsIdent("message") || isextend) {
    std::vector<std::string> struct_comment = doc_comment_;
    NEXT();
    StructDef *struct_def = nullptr;
    Namespace *parent_namespace = nullptr;
    if (isextend) {
      if (Is('.')) NEXT();  // qualified names may start with a . ?
      auto id = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(ParseNamespacing(&id, nullptr));
      struct_def = LookupCreateStruct(id, false);
      if (!struct_def)
        return Error("cannot extend unknown message type: " + id);
    } else {
      std::string name = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(StartStruct(name, &struct_def));
      // Since message definitions can be nested, we create a new namespace.
      auto ns = new Namespace();
      // Copy of current namespace.
      *ns = *current_namespace_;
      // But with current message name.
      ns->components.push_back(name);
      ns->from_table++;
      parent_namespace = current_namespace_;
      current_namespace_ = UniqueNamespace(ns);
    }
    struct_def->doc_comment = struct_comment;
    ECHECK(ParseProtoFields(struct_def, isextend, false));
    if (!isextend) { current_namespace_ = parent_namespace; }
    if (Is(';')) NEXT();
  } else if (IsIdent("enum")) {
    // These are almost the same, just with different terminator:
    EnumDef *enum_def;
    ECHECK(ParseEnum(false, &enum_def, nullptr));
    if (Is(';')) NEXT();
    // Temp: remove any duplicates, as .fbs files can't handle them.
    enum_def->RemoveDuplicates();
  } else if (IsIdent("syntax")) {  // Skip these.
    NEXT();
    EXPECT('=');
    EXPECT(kTokenStringConstant);
    EXPECT(';');
  } else if (IsIdent("option")) {  // Skip these.
    ECHECK(ParseProtoOption());
    EXPECT(';');
  } else if (IsIdent("service")) {  // Skip these.
    NEXT();
    EXPECT(kTokenIdentifier);
    ECHECK(ParseProtoCurliesOrIdent());
  } else {
    return Error("don\'t know how to parse .proto declaration starting with " +
                 TokenToStringId(token_));
  }
  return NoError();
}